

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.cpp
# Opt level: O3

void Diligent::anon_unknown_61::ValidateGraphicsPipelineCreateInfo
               (GraphicsPipelineStateCreateInfo *CreateInfo,IRenderDevice *pDevice)

{
  Uint32 *Args_6;
  PIPELINE_TYPE PVar1;
  byte bVar2;
  TEXTURE_FORMAT TVar3;
  char *pcVar4;
  LayoutElement *pLVar5;
  PIPELINE_SHADING_RATE_FLAGS PVar6;
  int iVar7;
  uint extraout_EAX;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  char **Args_10;
  TextureFormatAttribs *pTVar10;
  char (*in_RCX) [19];
  ulong uVar11;
  PIPELINE_SHADING_RATE_FLAGS Flags;
  undefined1 auVar12 [16];
  char (*in_stack_ffffffffffffff78) [36];
  char *local_80;
  char *local_78;
  string msg;
  uint local_34;
  long lVar9;
  undefined4 extraout_var_15;
  
  if (pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[19]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x751392,in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x22a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  iVar7 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
  lVar9 = CONCAT44(extraout_var,iVar7);
  iVar7 = (*(pDevice->super_IObject)._vptr_IObject[0x19])(pDevice);
  PVar1 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType;
  if ((PVar1 & ~PIPELINE_TYPE_MESH) != PIPELINE_TYPE_GRAPHICS) {
    msg._M_dataplus._M_p = GetPipelineTypeString(PVar1);
    pcVar4 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    local_80 = "";
    if (pcVar4 != (char *)0x0) {
      local_80 = pcVar4;
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[40]>
              (false,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x230,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
               &local_80,(char (*) [15])"\' is invalid: ",
               (char (*) [40])"Pipeline type must be GRAPHICS or MESH.");
  }
  ValidatePipelineResourceSignatures(&CreateInfo->super_PipelineStateCreateInfo,pDevice);
  local_78._0_4_ = 0;
  do {
    uVar11 = (ulong)(uint)local_78;
    if (((CreateInfo->GraphicsPipeline).BlendDesc.RenderTargets[uVar11].BlendEnable == true) &&
       (((uint)local_78 == 0 ||
        ((CreateInfo->GraphicsPipeline).BlendDesc.IndependentBlendEnable == true)))) {
      if ((CreateInfo->GraphicsPipeline).BlendDesc.RenderTargets[uVar11].SrcBlend ==
          BLEND_FACTOR_UNDEFINED) {
        msg._M_dataplus._M_p =
             GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType)
        ;
        local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_80 == (char *)0x0) {
          local_80 = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[25],unsigned_int,char[47]>
                  (false,"ValidateBlendStateDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x96,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                   &local_80,(char (*) [15])"\' is invalid: ",
                   (char (*) [25])"BlendDesc.RenderTargets[",(uint *)&local_78,
                   (char (*) [47])"].SrcBlend must not be BLEND_FACTOR_UNDEFINED.");
      }
      if ((CreateInfo->GraphicsPipeline).BlendDesc.RenderTargets[uVar11].DestBlend ==
          BLEND_FACTOR_UNDEFINED) {
        msg._M_dataplus._M_p =
             GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType)
        ;
        local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_80 == (char *)0x0) {
          local_80 = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[25],unsigned_int,char[48]>
                  (false,"ValidateBlendStateDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x98,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                   &local_80,(char (*) [15])"\' is invalid: ",
                   (char (*) [25])"BlendDesc.RenderTargets[",(uint *)&local_78,
                   (char (*) [48])"].DestBlend must not be BLEND_FACTOR_UNDEFINED.");
      }
      if ((CreateInfo->GraphicsPipeline).BlendDesc.RenderTargets[uVar11].BlendOp ==
          BLEND_OPERATION_UNDEFINED) {
        msg._M_dataplus._M_p =
             GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType)
        ;
        local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_80 == (char *)0x0) {
          local_80 = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[25],unsigned_int,char[49]>
                  (false,"ValidateBlendStateDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x9a,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                   &local_80,(char (*) [15])"\' is invalid: ",
                   (char (*) [25])"BlendDesc.RenderTargets[",(uint *)&local_78,
                   (char (*) [49])"].BlendOp must not be BLEND_OPERATION_UNDEFINED.");
      }
      if ((CreateInfo->GraphicsPipeline).BlendDesc.RenderTargets[uVar11].SrcBlendAlpha ==
          BLEND_FACTOR_UNDEFINED) {
        msg._M_dataplus._M_p =
             GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType)
        ;
        local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_80 == (char *)0x0) {
          local_80 = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[25],unsigned_int,char[52]>
                  (false,"ValidateBlendStateDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x9d,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                   &local_80,(char (*) [15])"\' is invalid: ",
                   (char (*) [25])"BlendDesc.RenderTargets[",(uint *)&local_78,
                   (char (*) [52])"].SrcBlendAlpha must not be BLEND_FACTOR_UNDEFINED.");
      }
      if ((CreateInfo->GraphicsPipeline).BlendDesc.RenderTargets[uVar11].DestBlendAlpha ==
          BLEND_FACTOR_UNDEFINED) {
        msg._M_dataplus._M_p =
             GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType)
        ;
        local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_80 == (char *)0x0) {
          local_80 = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[25],unsigned_int,char[53]>
                  (false,"ValidateBlendStateDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x9f,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                   &local_80,(char (*) [15])"\' is invalid: ",
                   (char (*) [25])"BlendDesc.RenderTargets[",(uint *)&local_78,
                   (char (*) [53])"].DestBlendAlpha must not be BLEND_FACTOR_UNDEFINED.");
      }
      if ((CreateInfo->GraphicsPipeline).BlendDesc.RenderTargets[uVar11].BlendOpAlpha ==
          BLEND_OPERATION_UNDEFINED) {
        msg._M_dataplus._M_p =
             GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType)
        ;
        local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_80 == (char *)0x0) {
          local_80 = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[25],unsigned_int,char[54]>
                  (false,"ValidateBlendStateDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0xa1,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                   &local_80,(char (*) [15])"\' is invalid: ",
                   (char (*) [25])"BlendDesc.RenderTargets[",(uint *)&local_78,
                   (char (*) [54])"].BlendOpAlpha must not be BLEND_OPERATION_UNDEFINED.");
      }
    }
    local_78._0_4_ = (uint)local_78 + 1;
  } while ((uint)local_78 < 8);
  if ((CreateInfo->GraphicsPipeline).RasterizerDesc.FillMode == FILL_MODE_UNDEFINED) {
    msg._M_dataplus._M_p =
         GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    if (local_80 == (char *)0x0) {
      local_80 = "";
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[57]>
              (false,"ValidateRasterizerStateDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x31,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,&local_80
               ,(char (*) [15])"\' is invalid: ",
               (char (*) [57])"RasterizerDesc.FillMode must not be FILL_MODE_UNDEFINED.");
  }
  if ((CreateInfo->GraphicsPipeline).RasterizerDesc.CullMode == CULL_MODE_UNDEFINED) {
    msg._M_dataplus._M_p =
         GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    if (local_80 == (char *)0x0) {
      local_80 = "";
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[57]>
              (false,"ValidateRasterizerStateDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x33,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,&local_80
               ,(char (*) [15])"\' is invalid: ",
               (char (*) [57])"RasterizerDesc.CullMode must not be CULL_MODE_UNDEFINED.");
  }
  if (((CreateInfo->GraphicsPipeline).RasterizerDesc.DepthClipEnable == false) &&
     (*(char *)(lVar9 + 0x1c) == '\0')) {
    FormatString<char[104]>
              (&msg,(char (*) [104])
                    "Disabling depth clip is not supported by this device. Check the value of the DepthClamp device feature."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (((CreateInfo->GraphicsPipeline).DepthStencilDesc.DepthEnable == true) &&
     ((CreateInfo->GraphicsPipeline).DepthStencilDesc.DepthFunc == COMPARISON_FUNC_UNKNOWN)) {
    msg._M_dataplus._M_p =
         GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    if (local_80 == (char *)0x0) {
      local_80 = "";
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[86]>
              (false,"ValidateDepthStencilDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x3c,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,&local_80
               ,(char (*) [15])"\' is invalid: ",
               (char (*) [86])
               "DepthStencilDesc.DepthFunc must not be COMPARISON_FUNC_UNKNOWN when depth is enabled."
              );
  }
  msg._M_dataplus._M_p = &(CreateInfo->GraphicsPipeline).DepthStencilDesc.DepthEnable;
  msg._M_string_length = (size_type)CreateInfo;
  ValidateDepthStencilDesc::anon_class_16_2_777d8791::operator()
            ((anon_class_16_2_777d8791 *)&msg,
             &(CreateInfo->GraphicsPipeline).DepthStencilDesc.FrontFace,"FrontFace");
  ValidateDepthStencilDesc::anon_class_16_2_777d8791::operator()
            ((anon_class_16_2_777d8791 *)&msg,
             &(CreateInfo->GraphicsPipeline).DepthStencilDesc.BackFace,"BackFace");
  if ((CreateInfo->GraphicsPipeline).NumViewports == '\0') {
    msg._M_dataplus._M_p =
         GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    if (local_80 == (char *)0x0) {
      local_80 = "";
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[36]>
              (false,"ValidateGraphicsPipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x53,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,&local_80
               ,(char (*) [15])"\' is invalid: ",
               (char (*) [36])"NumViewports must be greater than 0");
  }
  PVar6 = (CreateInfo->GraphicsPipeline).ShadingRateFlags;
  if (PVar6 != PIPELINE_SHADING_RATE_FLAG_NONE) {
    if (((*(byte *)(CONCAT44(extraout_var_00,iVar7) + 0x154) & 8) == 0) &&
       ((-1 << ((CreateInfo->GraphicsPipeline).SmplDesc.Count & 0x1f) |
        (CreateInfo->GraphicsPipeline).SampleMask) != 0xffffffff)) {
      msg._M_dataplus._M_p =
           GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
      if (local_80 == (char *)0x0) {
        local_80 = "";
      }
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[117]>
                (false,"ValidateGraphicsPipelineDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x5c,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                 &local_80,(char (*) [15])"\' is invalid: ",
                 (char (*) [117])
                 "SampleMask with zero bits is used with ShadingRateFlags, which requires SHADING_RATE_CAP_FLAG_SAMPLE_MASK capability"
                );
      PVar6 = (CreateInfo->GraphicsPipeline).ShadingRateFlags;
    }
    if ((((PVar6 & PIPELINE_SHADING_RATE_FLAG_PER_PRIMITIVE) != PIPELINE_SHADING_RATE_FLAG_NONE) &&
        (1 < (CreateInfo->GraphicsPipeline).NumViewports)) &&
       ((*(byte *)(CONCAT44(extraout_var_00,iVar7) + 0x154) & 0x40) == 0)) {
      msg._M_dataplus._M_p =
           GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
      if (local_80 == (char *)0x0) {
        local_80 = "";
      }
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[125]>
                (false,"ValidateGraphicsPipelineDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,99,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,&local_80
                 ,(char (*) [15])"\' is invalid: ",
                 (char (*) [125])
                 "Multiple viewports with variable shading rate require SHADING_RATE_CAP_FLAG_PER_PRIMITIVE_WITH_MULTIPLE_VIEWPORTS capability"
                );
    }
  }
  Args_6 = &(CreateInfo->GraphicsPipeline).InputLayout.NumElements;
  uVar8 = (CreateInfo->GraphicsPipeline).InputLayout.NumElements;
  if ((uVar8 != 0) &&
     ((CreateInfo->GraphicsPipeline).InputLayout.LayoutElements == (LayoutElement *)0x0)) {
    msg._M_dataplus._M_p =
         GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    if (local_80 == (char *)0x0) {
      local_80 = "";
    }
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[75],unsigned_int,char[15]>
              (false,"ValidateGraphicsPipelineDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x69,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,&local_80
               ,(char (*) [15])"\' is invalid: ",
               (char (*) [75])
               "InputLayout.LayoutElements must not be null when InputLayout.NumElements (",Args_6,
               (char (*) [15])") is not zero.");
    uVar8 = (CreateInfo->GraphicsPipeline).InputLayout.NumElements;
  }
  local_78._0_4_ = 0;
  if (uVar8 != 0) {
    do {
      pLVar5 = (CreateInfo->GraphicsPipeline).InputLayout.LayoutElements;
      uVar11 = (ulong)(uint)local_78;
      if (0x1f < pLVar5[uVar11].BufferSlot) {
        msg._M_dataplus._M_p =
             GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType)
        ;
        local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_80 == (char *)0x0) {
          local_80 = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[28],unsigned_int,char[15],unsigned_int,char[22],unsigned_int,char[3]>
                  (false,"ValidateGraphicsPipelineDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x6f,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                   &local_80,(char (*) [15])"\' is invalid: ",
                   (char (*) [28])"InputLayout.LayoutElements[",(uint *)&local_78,
                   (char (*) [15])"].BufferSlot (",&pLVar5[uVar11].BufferSlot,
                   (char (*) [22])") exceeds the limit (",&MAX_BUFFER_SLOTS,(char (*) [3])0x75ce90);
        uVar8 = (CreateInfo->GraphicsPipeline).InputLayout.NumElements;
      }
      local_78._0_4_ = (uint)local_78 + 1;
    } while ((uint)local_78 < uVar8);
  }
  ValidatePipelineResourceLayoutDesc
            ((PipelineStateDesc *)CreateInfo,(DeviceFeatures *)(lVar9 + 0xc));
  PVar1 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType;
  uVar8 = (uint)PVar1;
  if (PVar1 == PIPELINE_TYPE_MESH) {
    if (CreateInfo->pMS == (IShader *)0x0) {
      msg._M_dataplus._M_p = GetPipelineTypeString(PIPELINE_TYPE_MESH);
      local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
      if (local_80 == (char *)0x0) {
        local_80 = "";
      }
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[30]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x247,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                 &local_80,(char (*) [15])"\' is invalid: ",
                 (char (*) [30])"Mesh shader must not be null.");
      uVar8 = extraout_EAX;
    }
    auVar12._0_4_ = -(uint)(*(int *)&CreateInfo->pVS == 0 && *(int *)&CreateInfo->pDS == 0);
    auVar12._4_4_ =
         -(uint)(*(int *)((long)&CreateInfo->pVS + 4) == 0 &&
                *(int *)((long)&CreateInfo->pDS + 4) == 0);
    auVar12._8_4_ = -(uint)(*(int *)&CreateInfo->pAS == 0 && *(int *)&CreateInfo->pHS == 0);
    auVar12._12_4_ =
         -(uint)(*(int *)((long)&CreateInfo->pAS + 4) == 0 &&
                *(int *)((long)&CreateInfo->pHS + 4) == 0);
    iVar7 = movmskps(uVar8,auVar12);
    if (iVar7 != 0xf) {
      FormatString<char[80]>
                (&msg,(char (*) [80])
                      "Vertex, geometry and tessellation shaders are not supported in a mesh pipeline."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x24a);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    if (*Args_6 != 0) {
      FormatString<char[44]>(&msg,(char (*) [44])"Input layout is ignored in a mesh pipeline.");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x24b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    if ((CreateInfo->GraphicsPipeline).PrimitiveTopology < PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP)
    goto LAB_004ae180;
    FormatString<char[109]>
              (&msg,(char (*) [109])
                    "Primitive topology is ignored in a mesh pipeline, set it to undefined or keep default value (triangle list)."
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x24e);
  }
  else {
    if (PVar1 != PIPELINE_TYPE_GRAPHICS) goto LAB_004ae180;
    if (CreateInfo->pVS == (IShader *)0x0) {
      msg._M_dataplus._M_p = GetPipelineTypeString(PIPELINE_TYPE_GRAPHICS);
      local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
      if (local_80 == (char *)0x0) {
        local_80 = "";
      }
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[32]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x240,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                 &local_80,(char (*) [15])"\' is invalid: ",
                 (char (*) [32])"Vertex shader must not be null.");
    }
    if (CreateInfo->pMS == (IShader *)0x0 && CreateInfo->pAS == (IShader *)0x0) goto LAB_004ae180;
    FormatString<char[53]>
              (&msg,(char (*) [53])"Mesh shaders are not supported in graphics pipeline.");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x242);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)msg._M_dataplus._M_p != &msg.field_2) {
    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
  }
LAB_004ae180:
  if (CreateInfo->pVS != (IShader *)0x0) {
    iVar7 = (*(CreateInfo->pVS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    if (*(int *)(CONCAT44(extraout_var_01,iVar7) + 8) != 1) {
      iVar7 = (*(CreateInfo->pVS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      msg._M_dataplus._M_p =
           GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_02,iVar7) + 8));
      LogError<true,char_const*,char[26],char[7],char[8]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x252,(char **)&msg,(char (*) [26])" is not a valid type for ",
                 (char (*) [7])0x75f7ca,(char (*) [8])0x751243);
    }
  }
  if (CreateInfo->pPS != (IShader *)0x0) {
    iVar7 = (*(CreateInfo->pPS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    if (*(int *)(CONCAT44(extraout_var_03,iVar7) + 8) != 2) {
      iVar7 = (*(CreateInfo->pPS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      msg._M_dataplus._M_p =
           GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_04,iVar7) + 8));
      LogError<true,char_const*,char[26],char[6],char[8]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x253,(char **)&msg,(char (*) [26])" is not a valid type for ",
                 (char (*) [6])"pixel",(char (*) [8])0x751243);
    }
  }
  if (CreateInfo->pGS != (IShader *)0x0) {
    iVar7 = (*(CreateInfo->pGS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    if (*(int *)(CONCAT44(extraout_var_05,iVar7) + 8) != 4) {
      iVar7 = (*(CreateInfo->pGS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      msg._M_dataplus._M_p =
           GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_06,iVar7) + 8));
      LogError<true,char_const*,char[26],char[9],char[8]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x254,(char **)&msg,(char (*) [26])" is not a valid type for ",
                 (char (*) [9])"geometry",(char (*) [8])0x751243);
    }
  }
  if (CreateInfo->pHS != (IShader *)0x0) {
    iVar7 = (*(CreateInfo->pHS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    if (*(int *)(CONCAT44(extraout_var_07,iVar7) + 8) != 8) {
      iVar7 = (*(CreateInfo->pHS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      msg._M_dataplus._M_p =
           GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_08,iVar7) + 8));
      LogError<true,char_const*,char[26],char[5],char[8]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x255,(char **)&msg,(char (*) [26])" is not a valid type for ",
                 (char (*) [5])"hull",(char (*) [8])0x751243);
    }
  }
  if (CreateInfo->pDS != (IShader *)0x0) {
    iVar7 = (*(CreateInfo->pDS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    if (*(int *)(CONCAT44(extraout_var_09,iVar7) + 8) != 0x10) {
      iVar7 = (*(CreateInfo->pDS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      msg._M_dataplus._M_p =
           GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_10,iVar7) + 8));
      LogError<true,char_const*,char[26],char[7],char[8]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x256,(char **)&msg,(char (*) [26])" is not a valid type for ",
                 (char (*) [7])0x6f7458,(char (*) [8])0x751243);
    }
  }
  if (CreateInfo->pAS != (IShader *)0x0) {
    iVar7 = (*(CreateInfo->pAS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    if (*(int *)(CONCAT44(extraout_var_11,iVar7) + 8) != 0x40) {
      iVar7 = (*(CreateInfo->pAS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      msg._M_dataplus._M_p =
           GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_12,iVar7) + 8));
      LogError<true,char_const*,char[26],char[14],char[8]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,599,(char **)&msg,(char (*) [26])" is not a valid type for ",
                 (char (*) [14])"amplification",(char (*) [8])0x751243);
    }
  }
  if (CreateInfo->pMS != (IShader *)0x0) {
    iVar7 = (*(CreateInfo->pMS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    if (*(int *)(CONCAT44(extraout_var_13,iVar7) + 8) != 0x80) {
      iVar7 = (*(CreateInfo->pMS->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      msg._M_dataplus._M_p =
           GetShaderTypeLiteralName(*(SHADER_TYPE *)(CONCAT44(extraout_var_14,iVar7) + 8));
      LogError<true,char_const*,char[26],char[5],char[8]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,600,(char **)&msg,(char (*) [26])" is not a valid type for ",(char (*) [5])"mesh",
                 (char (*) [8])0x751243);
    }
  }
  if ((CreateInfo->GraphicsPipeline).pRenderPass == (IRenderPass *)0x0) {
    local_78._0_4_ = 0;
    if ((CreateInfo->GraphicsPipeline).NumRenderTargets != '\0') {
      do {
        TVar3 = (CreateInfo->GraphicsPipeline).RTVFormats[(uint)local_78];
        if (TVar3 != TEX_FORMAT_UNKNOWN) {
          pTVar10 = GetTextureFormatAttribs(TVar3);
          if ((pTVar10->ComponentType < 0xb) &&
             ((0x580U >> (pTVar10->ComponentType & 0x1f) & 1) != 0)) {
            msg._M_dataplus._M_p =
                 GetPipelineTypeString
                           ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
            local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs
                       .Name;
            if (local_80 == (char *)0x0) {
              local_80 = "";
            }
            LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[8],char_const*,char[24],unsigned_int,char[66]>
                      (false,"ValidateGraphicsPipelineCreateInfo",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                       ,0x27c,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                       &local_80,(char (*) [15])"\' is invalid: ",(char (*) [8])"Format ",
                       &pTVar10->Name,(char (*) [24])" of render target slot ",(uint *)&local_78,
                       (char (*) [66])
                       " is invalid: depth-stencil or compressed formats are not allowed.");
          }
        }
        local_78._0_4_ = (uint)local_78 + 1;
      } while ((uint)local_78 < (CreateInfo->GraphicsPipeline).NumRenderTargets);
    }
    TVar3 = (CreateInfo->GraphicsPipeline).DSVFormat;
    if (TVar3 != TEX_FORMAT_UNKNOWN) {
      pTVar10 = GetTextureFormatAttribs(TVar3);
      if (1 < (byte)(pTVar10->ComponentType - COMPONENT_TYPE_DEPTH)) {
        msg._M_dataplus._M_p =
             GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType)
        ;
        local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_80 == (char *)0x0) {
          local_80 = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char_const*,char[37]>
                  (false,"ValidateGraphicsPipelineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x286,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                   &local_80,(char (*) [15])"\' is invalid: ",&pTVar10->Name,(char (*) [37])0x75ad3a
                  );
      }
      if (((CreateInfo->GraphicsPipeline).ReadOnlyDSV == true) &&
         ((CreateInfo->GraphicsPipeline).DepthStencilDesc.DepthWriteEnable == true)) {
        msg._M_dataplus._M_p =
             GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType)
        ;
        local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_80 == (char *)0x0) {
          local_80 = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[74]>
                  (false,"ValidateGraphicsPipelineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x28a,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                   &local_80,(char (*) [15])"\' is invalid: ",
                   (char (*) [74])
                   "DepthStencilDesc.DepthWriteEnable can\'t be true when ReadOnlyDSV is true.");
      }
    }
    bVar2 = (CreateInfo->GraphicsPipeline).NumRenderTargets;
    uVar8 = (uint)bVar2;
    local_80 = (char *)CONCAT44(local_80._4_4_,(uint)bVar2);
    if (bVar2 < 8) {
      do {
        TVar3 = (CreateInfo->GraphicsPipeline).RTVFormats[uVar8];
        if (TVar3 != TEX_FORMAT_UNKNOWN) {
          pTVar10 = GetTextureFormatAttribs(TVar3);
          FormatString<char[23],char_const*,char[18],unsigned_int,char[36]>
                    (&msg,(Diligent *)"Render target format (",(char (*) [23])pTVar10,
                     (char **)") of unused slot ",(char (*) [18])&local_80,
                     (uint *)" must be set to TEX_FORMAT_UNKNOWN.",in_stack_ffffffffffffff78);
          if (DebugMessageCallback != (undefined *)0x0) {
            (*(code *)DebugMessageCallback)(1,msg._M_dataplus._M_p,0,0,0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)msg._M_dataplus._M_p != &msg.field_2) {
            operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
          }
          uVar8 = (uint)local_80;
        }
        uVar8 = uVar8 + 1;
        local_80 = (char *)CONCAT44(local_80._4_4_,uVar8);
      } while (uVar8 < 8);
    }
    if ((CreateInfo->GraphicsPipeline).SubpassIndex != '\0') {
      msg._M_dataplus._M_p =
           GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
      if (local_80 == (char *)0x0) {
        local_80 = "";
      }
      local_78._0_4_ = (uint)(CreateInfo->GraphicsPipeline).SubpassIndex;
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[16],unsigned_int,char[51]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x298,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                 &local_80,(char (*) [15])"\' is invalid: ",(char (*) [16])"Subpass index (",
                 (uint *)&local_78,
                 (char (*) [51])") must be 0 when explicit render pass is not used.");
    }
  }
  else {
    if ((CreateInfo->GraphicsPipeline).NumRenderTargets != '\0') {
      msg._M_dataplus._M_p =
           GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
      if (local_80 == (char *)0x0) {
        local_80 = "";
      }
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[62]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x25e,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                 &local_80,(char (*) [15])"\' is invalid: ",
                 (char (*) [62])"NumRenderTargets must be 0 when explicit render pass is used.");
    }
    if ((CreateInfo->GraphicsPipeline).DSVFormat != TEX_FORMAT_UNKNOWN) {
      msg._M_dataplus._M_p =
           GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
      if (local_80 == (char *)0x0) {
        local_80 = "";
      }
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[72]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x260,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                 &local_80,(char (*) [15])"\' is invalid: ",
                 (char (*) [72])
                 "DSVFormat must be TEX_FORMAT_UNKNOWN when explicit render pass is used.");
    }
    if ((CreateInfo->GraphicsPipeline).ReadOnlyDSV == true) {
      msg._M_dataplus._M_p =
           GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
      if (local_80 == (char *)0x0) {
        local_80 = "";
      }
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[61]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x262,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                 &local_80,(char (*) [15])"\' is invalid: ",
                 (char (*) [61])"ReadOnlyDSV must be false when explicit render pass is used.");
    }
    local_78._0_4_ = 0;
    do {
      if ((CreateInfo->GraphicsPipeline).RTVFormats[(uint)local_78] != TEX_FORMAT_UNKNOWN) {
        msg._M_dataplus._M_p =
             GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType)
        ;
        local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.
                   Name;
        if (local_80 == (char *)0x0) {
          local_80 = "";
        }
        LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[12],unsigned_int,char[64]>
                  (false,"ValidateGraphicsPipelineCreateInfo",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                   ,0x267,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                   &local_80,(char (*) [15])"\' is invalid: ",(char (*) [12])"RTVFormats[",
                   (uint *)&local_78,
                   (char (*) [64])"] must be TEX_FORMAT_UNKNOWN when explicit render pass is used.")
        ;
      }
      local_78._0_4_ = (uint)local_78 + 1;
    } while ((uint)local_78 < 8);
    iVar7 = (*(((CreateInfo->GraphicsPipeline).pRenderPass)->super_IDeviceObject).super_IObject.
              _vptr_IObject[4])();
    Args_10 = (char **)CONCAT44(extraout_var_15,iVar7);
    if (*(uint *)(Args_10 + 3) <= (uint)(CreateInfo->GraphicsPipeline).SubpassIndex) {
      msg._M_dataplus._M_p =
           GetPipelineTypeString((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
      local_80 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
      if (local_80 == (char *)0x0) {
        local_80 = "";
      }
      local_78._0_4_ = (uint)(CreateInfo->GraphicsPipeline).SubpassIndex;
      local_34 = *(uint *)(Args_10 + 3);
      LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[16],unsigned_int,char[36],unsigned_int,char[19],char_const*,char[3]>
                (false,"ValidateGraphicsPipelineCreateInfo",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
                 ,0x26c,(char (*) [16])"Description of ",(char **)&msg,(char (*) [7])0x6a829c,
                 &local_80,(char (*) [15])"\' is invalid: ",(char (*) [16])"Subpass index (",
                 (uint *)&local_78,(char (*) [36])") exceeds the number of subpasses (",&local_34,
                 (char (*) [19])") in render pass \'",Args_10,(char (*) [3])"\'.");
    }
  }
  if (((CreateInfo->GraphicsPipeline).ShadingRateFlags != PIPELINE_SHADING_RATE_FLAG_NONE) &&
     (*(char *)(lVar9 + 0x33) == '\0')) {
    local_80 = GetPipelineTypeString
                         ((CreateInfo->super_PipelineStateCreateInfo).PSODesc.PipelineType);
    pcVar4 = (CreateInfo->super_PipelineStateCreateInfo).PSODesc.super_DeviceObjectAttribs.Name;
    local_78 = "";
    if (pcVar4 != (char *)0x0) {
      local_78 = pcVar4;
    }
    GetPipelineShadingRateFlagsString_abi_cxx11_
              (&msg,(Diligent *)(ulong)(CreateInfo->GraphicsPipeline).ShadingRateFlags,Flags);
    LogError<true,char[16],char_const*,char[7],char_const*,char[15],char[19],std::__cxx11::string,char[38]>
              (false,"ValidateGraphicsPipelineCreateInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/PipelineStateBase.cpp"
               ,0x29e,(char (*) [16])"Description of ",&local_80,(char (*) [7])0x6a829c,&local_78,
               (char (*) [15])"\' is invalid: ",(char (*) [19])"ShadingRateFlags (",&msg,
               (char (*) [38])") require VariableRateShading feature");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void ValidateGraphicsPipelineCreateInfo(const GraphicsPipelineStateCreateInfo& CreateInfo,
                                        const IRenderDevice*                   pDevice) noexcept(false)
{
    VERIFY_EXPR(pDevice != nullptr);
    const DeviceFeatures&      Features    = pDevice->GetDeviceInfo().Features;
    const GraphicsAdapterInfo& AdapterInfo = pDevice->GetAdapterInfo();

    const PipelineStateDesc& PSODesc = CreateInfo.PSODesc;
    if (PSODesc.PipelineType != PIPELINE_TYPE_GRAPHICS && PSODesc.PipelineType != PIPELINE_TYPE_MESH)
        LOG_PSO_ERROR_AND_THROW("Pipeline type must be GRAPHICS or MESH.");

    ValidatePipelineResourceSignatures(CreateInfo, pDevice);

    const GraphicsPipelineDesc& GraphicsPipeline = CreateInfo.GraphicsPipeline;

    ValidateBlendStateDesc(PSODesc, GraphicsPipeline);
    ValidateRasterizerStateDesc(PSODesc, GraphicsPipeline, Features);
    ValidateDepthStencilDesc(PSODesc, GraphicsPipeline);
    ValidateGraphicsPipelineDesc(PSODesc, GraphicsPipeline, AdapterInfo.ShadingRate);
    ValidatePipelineResourceLayoutDesc(PSODesc, Features);


    if (PSODesc.PipelineType == PIPELINE_TYPE_GRAPHICS)
    {
        if (CreateInfo.pVS == nullptr)
            LOG_PSO_ERROR_AND_THROW("Vertex shader must not be null.");

        DEV_CHECK_ERR(CreateInfo.pAS == nullptr && CreateInfo.pMS == nullptr, "Mesh shaders are not supported in graphics pipeline.");
    }
    else if (PSODesc.PipelineType == PIPELINE_TYPE_MESH)
    {
        if (CreateInfo.pMS == nullptr)
            LOG_PSO_ERROR_AND_THROW("Mesh shader must not be null.");

        DEV_CHECK_ERR(CreateInfo.pVS == nullptr && CreateInfo.pGS == nullptr && CreateInfo.pDS == nullptr && CreateInfo.pHS == nullptr,
                      "Vertex, geometry and tessellation shaders are not supported in a mesh pipeline.");
        DEV_CHECK_ERR(GraphicsPipeline.InputLayout.NumElements == 0, "Input layout is ignored in a mesh pipeline.");
        DEV_CHECK_ERR(GraphicsPipeline.PrimitiveTopology == PRIMITIVE_TOPOLOGY_TRIANGLE_LIST ||
                          GraphicsPipeline.PrimitiveTopology == PRIMITIVE_TOPOLOGY_UNDEFINED,
                      "Primitive topology is ignored in a mesh pipeline, set it to undefined or keep default value (triangle list).");
    }


    VALIDATE_SHADER_TYPE(CreateInfo.pVS, SHADER_TYPE_VERTEX, "vertex")
    VALIDATE_SHADER_TYPE(CreateInfo.pPS, SHADER_TYPE_PIXEL, "pixel")
    VALIDATE_SHADER_TYPE(CreateInfo.pGS, SHADER_TYPE_GEOMETRY, "geometry")
    VALIDATE_SHADER_TYPE(CreateInfo.pHS, SHADER_TYPE_HULL, "hull")
    VALIDATE_SHADER_TYPE(CreateInfo.pDS, SHADER_TYPE_DOMAIN, "domain")
    VALIDATE_SHADER_TYPE(CreateInfo.pAS, SHADER_TYPE_AMPLIFICATION, "amplification")
    VALIDATE_SHADER_TYPE(CreateInfo.pMS, SHADER_TYPE_MESH, "mesh")


    if (GraphicsPipeline.pRenderPass != nullptr)
    {
        if (GraphicsPipeline.NumRenderTargets != 0)
            LOG_PSO_ERROR_AND_THROW("NumRenderTargets must be 0 when explicit render pass is used.");
        if (GraphicsPipeline.DSVFormat != TEX_FORMAT_UNKNOWN)
            LOG_PSO_ERROR_AND_THROW("DSVFormat must be TEX_FORMAT_UNKNOWN when explicit render pass is used.");
        if (GraphicsPipeline.ReadOnlyDSV)
            LOG_PSO_ERROR_AND_THROW("ReadOnlyDSV must be false when explicit render pass is used.");

        for (Uint32 rt = 0; rt < MAX_RENDER_TARGETS; ++rt)
        {
            if (GraphicsPipeline.RTVFormats[rt] != TEX_FORMAT_UNKNOWN)
                LOG_PSO_ERROR_AND_THROW("RTVFormats[", rt, "] must be TEX_FORMAT_UNKNOWN when explicit render pass is used.");
        }

        const RenderPassDesc& RPDesc = GraphicsPipeline.pRenderPass->GetDesc();
        if (GraphicsPipeline.SubpassIndex >= RPDesc.SubpassCount)
            LOG_PSO_ERROR_AND_THROW("Subpass index (", Uint32{GraphicsPipeline.SubpassIndex}, ") exceeds the number of subpasses (", Uint32{RPDesc.SubpassCount}, ") in render pass '", RPDesc.Name, "'.");
    }
    else
    {
        for (Uint32 rt = 0; rt < GraphicsPipeline.NumRenderTargets; ++rt)
        {
            const TEXTURE_FORMAT RTVFmt = GraphicsPipeline.RTVFormats[rt];
            if (RTVFmt == TEX_FORMAT_UNKNOWN)
                continue;

            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(RTVFmt);
            if (FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_DEPTH_STENCIL ||
                FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
            {
                LOG_PSO_ERROR_AND_THROW("Format ", FmtAttribs.Name, " of render target slot ", rt,
                                        " is invalid: depth-stencil or compressed formats are not allowed.");
            }
        }

        if (GraphicsPipeline.DSVFormat != TEX_FORMAT_UNKNOWN)
        {
            const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(GraphicsPipeline.DSVFormat);
            if (FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH &&
                FmtAttribs.ComponentType != COMPONENT_TYPE_DEPTH_STENCIL)
            {
                LOG_PSO_ERROR_AND_THROW(FmtAttribs.Name, " is not a valid depth buffer format.");
            }

            if (GraphicsPipeline.ReadOnlyDSV && GraphicsPipeline.DepthStencilDesc.DepthWriteEnable)
                LOG_PSO_ERROR_AND_THROW("DepthStencilDesc.DepthWriteEnable can't be true when ReadOnlyDSV is true.");
        }

        for (Uint32 rt = GraphicsPipeline.NumRenderTargets; rt < _countof(GraphicsPipeline.RTVFormats); ++rt)
        {
            TEXTURE_FORMAT RTVFmt = GraphicsPipeline.RTVFormats[rt];
            if (RTVFmt != TEX_FORMAT_UNKNOWN)
            {
                LOG_WARNING_MESSAGE("Render target format (", GetTextureFormatAttribs(RTVFmt).Name, ") of unused slot ", rt,
                                    " must be set to TEX_FORMAT_UNKNOWN.");
            }
        }

        if (GraphicsPipeline.SubpassIndex != 0)
            LOG_PSO_ERROR_AND_THROW("Subpass index (", Uint32{GraphicsPipeline.SubpassIndex}, ") must be 0 when explicit render pass is not used.");
    }

    if (CreateInfo.GraphicsPipeline.ShadingRateFlags != PIPELINE_SHADING_RATE_FLAG_NONE)
    {
        if (!Features.VariableRateShading)
            LOG_PSO_ERROR_AND_THROW("ShadingRateFlags (", GetPipelineShadingRateFlagsString(CreateInfo.GraphicsPipeline.ShadingRateFlags), ") require VariableRateShading feature");
    }
}